

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall
CLPIParser::composeEP_map_for_one_stream_PID
          (CLPIParser *this,BitStreamWriter *writer,M2TSStreamInfo *streamInfo)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  pointer pmVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  uint32_t uVar8;
  _Rb_tree_node_base *p_Var9;
  int iVar10;
  uint value;
  BluRayCoarseInfo *i;
  pointer pBVar11;
  vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> coarseInfo;
  vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> local_48;
  
  puVar3 = (writer->super_BitStream).m_initBuffer;
  iVar7 = *(int *)&(writer->super_BitStream).m_buffer - (int)puVar3;
  iVar1 = writer->m_bitWrited + iVar7 * 8;
  iVar7 = writer->m_bitWrited + iVar7 * 8 + 7;
  if (-1 < iVar1) {
    iVar7 = iVar1;
  }
  BitStreamWriter::putBits(writer,0x20,0);
  buildCoarseInfo(&local_48,this,streamInfo);
  for (pBVar11 = local_48.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pBVar11 !=
      local_48.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>._M_impl.
      super__Vector_impl_data._M_finish; pBVar11 = pBVar11 + 1) {
    BitStreamWriter::putBits(writer,0x12,pBVar11->m_fineRefID);
    BitStreamWriter::putBits(writer,0xe,pBVar11->m_coarsePts);
    BitStreamWriter::putBits(writer,0x20,pBVar11->m_pktCnt);
  }
  if (((*(int *)&(writer->super_BitStream).m_buffer -
       *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited & 0xf) != 0) {
    BitStreamWriter::putBits(writer,8,0);
  }
  iVar10 = *(int *)&(writer->super_BitStream).m_buffer -
           *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar1 = writer->m_bitWrited + iVar10 * 8;
  iVar10 = writer->m_bitWrited + iVar10 * 8 + 7;
  if (-1 < iVar1) {
    iVar10 = iVar1;
  }
  uVar8 = my_ntohl((iVar10 >> 3) - (iVar7 >> 3));
  *(uint32_t *)((long)puVar3 + (long)(iVar7 >> 3)) = uVar8;
  pmVar4 = (streamInfo->m_index).
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pmVar4 != (streamInfo->m_index).
                super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    sVar5 = this->m_clpiNum;
    for (p_Var9 = pmVar4[sVar5]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &pmVar4[sVar5]._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      BitStreamWriter::putBits(writer,1,0);
      if (*(int *)((long)&p_Var9[1]._M_parent + 4) == 0) {
        value = 0;
      }
      else {
        bVar6 = is4K();
        uVar2 = *(uint *)((long)&p_Var9[1]._M_parent + 4);
        value = 1;
        if (bVar6) {
          if (((0xbffff < uVar2) && (value = 2, 0x17ffff < uVar2)) &&
             ((value = 3, 0x23ffff < uVar2 &&
              ((value = 4, 0x2fffff < uVar2 && (value = 5, 0x3bffff < uVar2)))))) {
            bVar6 = uVar2 < 0x480000;
LAB_001e1fb8:
            value = 7 - bVar6;
          }
        }
        else if ((((0x1ffff < uVar2) && (value = 2, 0x3ffff < uVar2)) &&
                 (value = 3, 0x5ffff < uVar2)) &&
                ((value = 4, 0x8ffff < uVar2 && (value = 5, 0xdffff < uVar2)))) {
          bVar6 = uVar2 < 0x140000;
          goto LAB_001e1fb8;
        }
      }
      BitStreamWriter::putBits(writer,3,value);
      BitStreamWriter::putBits(writer,0xb,p_Var9[1]._M_color >> 9 & 0x7ff);
      BitStreamWriter::putBits(writer,0x11,*(uint *)&p_Var9[1]._M_parent & 0x1ffff);
    }
  }
  if (local_48.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CLPIParser::composeEP_map_for_one_stream_PID(BitStreamWriter& writer, M2TSStreamInfo& streamInfo) const
{
    const auto epFineStartAddr = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    const uint32_t beforePos = writer.getBitsCount() / 8;
    writer.putBits(32, 0);  // EP_fine_table_start_address
    const std::vector<BluRayCoarseInfo> coarseInfo = buildCoarseInfo(streamInfo);
    for (const auto& i : coarseInfo)
    {
        writer.putBits(18, i.m_fineRefID);  // ref_to_EP_fine_id[i]
        writer.putBits(14, i.m_coarsePts);  // PTS_EP_coarse[i]
        writer.putBits(32, i.m_pktCnt);     // SPN_EP_coarse[i]
    }
    if (writer.getBitsCount() % 16 != 0)
        writer.putBits(8, 0);  // padding_word
    *epFineStartAddr = my_htonl(writer.getBitsCount() / 8 - beforePos);
    if (!streamInfo.m_index.empty())
    {
        const PMTIndex& curIndex = streamInfo.m_index[m_clpiNum];
        for (const auto& [fst, snd] : curIndex)
        {
            const PMTIndexData& indexData = snd;
            writer.putBit(0);  // is_angle_change_point[EP_fine_id]
            int endCode = 0;
            if (indexData.m_frameLen > 0)
            {
                if (is4K())
                {
                    if (indexData.m_frameLen < 786432)
                        endCode = 1;
                    else if (indexData.m_frameLen < 1572864)
                        endCode = 2;
                    else if (indexData.m_frameLen < 2359296)
                        endCode = 3;
                    else if (indexData.m_frameLen < 3145728)
                        endCode = 4;
                    else if (indexData.m_frameLen < 3932160)
                        endCode = 5;
                    else if (indexData.m_frameLen < 4718592)
                        endCode = 6;
                    else
                        endCode = 7;
                }
                else
                {
                    if (indexData.m_frameLen < 131072)
                        endCode = 1;
                    else if (indexData.m_frameLen < 262144)
                        endCode = 2;
                    else if (indexData.m_frameLen < 393216)
                        endCode = 3;
                    else if (indexData.m_frameLen < 589824)
                        endCode = 4;
                    else if (indexData.m_frameLen < 917504)
                        endCode = 5;
                    else if (indexData.m_frameLen < 1310720)
                        endCode = 6;
                    else
                        endCode = 7;
                }
            }
            writer.putBits(3, endCode);                          // I_end_position_offset[EP_fine_id]
            writer.putBits(11, (fst >> 9) % (1 << 11));          // PTS_EP_fine[EP_fine_id]
            writer.putBits(17, indexData.m_pktCnt % (1 << 17));  // SPN_EP_fine[EP_fine_id]
        }
    }
}